

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O2

char * luaJIT_profile_dumpstack(lua_State *L,char *fmt,int depth,size_t *len)

{
  char *pcVar1;
  
  profile_state.sb.L.ptr32 = (uint32_t)L;
  profile_state.sb.p = profile_state.sb.b;
  lj_debug_dumpstack(L,&profile_state.sb,fmt,depth);
  pcVar1 = (char *)(ulong)profile_state.sb.b.ptr32;
  *len = (ulong)(profile_state.sb.p.ptr32 - profile_state.sb.b.ptr32);
  return pcVar1;
}

Assistant:

LUA_API const char *luaJIT_profile_dumpstack(lua_State *L, const char *fmt,
					     int depth, size_t *len)
{
  ProfileState *ps = &profile_state;
  SBuf *sb = &ps->sb;
  setsbufL(sb, L);
  lj_buf_reset(sb);
  lj_debug_dumpstack(L, sb, fmt, depth);
  *len = (size_t)sbuflen(sb);
  return sbufB(sb);
}